

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_BaseFab.H
# Opt level: O0

BaseFab<long> * __thiscall
amrex::BaseFab<long>::copy<(amrex::RunOn)0>
          (BaseFab<long> *this,BaseFab<long> *src,Box *srcbox,int srccomp,Box *destbox,int destcomp,
          int numcomp)

{
  undefined4 in_ECX;
  int *in_RDX;
  long in_RSI;
  BaseFab<long> *in_RDI;
  int *in_R8;
  Dim3 offset;
  Dim3 slo;
  Dim3 dlo;
  Array4<const_long> *s;
  Array4<long> *d;
  undefined1 local_448 [32];
  anon_class_152_5_d58b1f45 *in_stack_fffffffffffffbd8;
  int in_stack_fffffffffffffbe4;
  Box *in_stack_fffffffffffffbe8;
  undefined1 auStack_400 [64];
  undefined8 local_3c0;
  int local_3b8;
  undefined4 local_3b4;
  undefined4 local_3b0;
  int local_3ac;
  int iStack_3a8;
  int local_3a4;
  undefined8 local_3a0;
  int local_398;
  undefined8 local_38c;
  int local_384;
  undefined8 local_380;
  int local_378;
  undefined8 local_370;
  int local_368;
  Array4<const_long> local_360;
  Array4<const_long> *local_320;
  Array4<long> local_318;
  Array4<long> *local_2d8;
  int *local_2c8;
  undefined4 local_2bc;
  int *local_2b8;
  long local_2b0;
  undefined8 local_2a0;
  int local_298;
  int *local_290;
  int local_284;
  int iStack_280;
  int local_27c;
  undefined8 local_278;
  int local_270;
  int *local_268;
  int local_260;
  int iStack_25c;
  int local_258;
  undefined4 local_254;
  int *local_250;
  undefined4 local_244;
  int *local_240;
  undefined4 local_234;
  int *local_230;
  undefined4 local_224;
  int *local_220;
  undefined4 local_214;
  int *local_210;
  undefined4 local_204;
  int *local_200;
  undefined4 *local_1f8;
  long local_1e8;
  Dim3 local_1e0;
  Dim3 local_1d0;
  Dim3 local_1c0;
  Dim3 local_1b0;
  int local_1a4;
  Box *local_1a0;
  long *local_198;
  Dim3 local_190;
  Box *local_180;
  int local_178;
  int iStack_174;
  int local_170;
  undefined4 local_16c;
  Box *local_168;
  undefined4 local_15c;
  Box *local_158;
  undefined4 local_14c;
  Box *local_148;
  Dim3 local_140;
  Box *local_130;
  int local_128;
  int iStack_124;
  int local_120;
  undefined4 local_11c;
  IntVect *local_118;
  undefined4 local_10c;
  IntVect *local_108;
  undefined4 local_fc;
  IntVect *local_f8;
  Dim3 local_f0;
  Dim3 local_e0;
  Dim3 local_d0;
  Dim3 local_c0;
  int local_b4;
  undefined8 *local_b0;
  long *local_a8;
  Dim3 local_a0;
  undefined8 *local_90;
  undefined4 local_88;
  undefined4 uStack_84;
  int local_80;
  undefined4 local_7c;
  undefined8 *local_78;
  undefined4 local_6c;
  undefined8 *local_68;
  undefined4 local_5c;
  undefined8 *local_58;
  Dim3 local_50;
  undefined8 *local_40;
  int local_38;
  int iStack_34;
  int local_30;
  undefined4 local_2c;
  long local_28;
  undefined4 local_1c;
  long local_18;
  undefined4 local_c;
  int *local_8;
  
  local_198 = in_RDI->dptr;
  local_1a0 = &in_RDI->domain;
  local_1a4 = in_RDI->nvar;
  local_14c = 0;
  local_178 = (local_1a0->smallend).vect[0];
  local_15c = 1;
  iStack_174 = (in_RDI->domain).smallend.vect[1];
  local_1c0.x = (local_1a0->smallend).vect[0];
  local_1c0.y = (local_1a0->smallend).vect[1];
  local_16c = 2;
  local_1c0.z = (in_RDI->domain).smallend.vect[2];
  local_f8 = &(in_RDI->domain).bigend;
  local_fc = 0;
  local_128 = local_f8->vect[0] + 1;
  local_108 = &(in_RDI->domain).bigend;
  local_10c = 1;
  iStack_124 = (in_RDI->domain).bigend.vect[1] + 1;
  local_118 = &(in_RDI->domain).bigend;
  local_11c = 2;
  local_1e0.z = (in_RDI->domain).bigend.vect[2] + 1;
  local_1e0.y = iStack_124;
  local_1e0.x = local_128;
  local_2c8 = in_R8;
  local_2bc = in_ECX;
  local_2b8 = in_RDX;
  local_2b0 = in_RSI;
  local_1d0._0_8_ = local_1e0._0_8_;
  local_1d0.z = local_1e0.z;
  local_1b0._0_8_ = local_1c0._0_8_;
  local_1b0.z = local_1c0.z;
  local_190._0_8_ = local_1c0._0_8_;
  local_190.z = local_1c0.z;
  local_180 = local_1a0;
  local_170 = local_1c0.z;
  local_168 = local_1a0;
  local_158 = local_1a0;
  local_148 = local_1a0;
  local_140._0_8_ = local_1e0._0_8_;
  local_140.z = local_1e0.z;
  local_130 = local_1a0;
  local_120 = local_1e0.z;
  Array4<long>::Array4(&local_318,local_198,&local_1b0,&local_1d0,local_1a4);
  local_1e8 = local_2b0;
  local_a8 = *(long **)(local_2b0 + 0x10);
  local_b0 = (undefined8 *)(local_2b0 + 0x18);
  local_b4 = *(int *)(local_2b0 + 0x34);
  local_5c = 0;
  local_88 = *(undefined4 *)local_b0;
  local_6c = 1;
  uStack_84 = *(undefined4 *)(local_2b0 + 0x1c);
  local_d0._0_8_ = *local_b0;
  local_7c = 2;
  local_d0.z = *(int *)(local_2b0 + 0x20);
  local_8 = (int *)(local_2b0 + 0x24);
  local_c = 0;
  local_38 = *local_8 + 1;
  local_18 = local_2b0 + 0x24;
  local_1c = 1;
  iStack_34 = *(int *)(local_2b0 + 0x28) + 1;
  local_28 = local_2b0 + 0x24;
  local_2c = 2;
  local_f0.z = *(int *)(local_2b0 + 0x2c) + 1;
  local_f0.y = iStack_34;
  local_f0.x = local_38;
  local_2d8 = &local_318;
  local_e0._0_8_ = local_f0._0_8_;
  local_e0.z = local_f0.z;
  local_c0._0_8_ = local_d0._0_8_;
  local_c0.z = local_d0.z;
  local_a0._0_8_ = local_d0._0_8_;
  local_a0.z = local_d0.z;
  local_90 = local_b0;
  local_80 = local_d0.z;
  local_78 = local_b0;
  local_68 = local_b0;
  local_58 = local_b0;
  local_50._0_8_ = local_f0._0_8_;
  local_50.z = local_f0.z;
  local_40 = local_b0;
  local_30 = local_f0.z;
  Array4<const_long>::Array4(&local_360,local_a8,&local_c0,&local_e0,local_b4);
  local_268 = local_2c8;
  local_230 = local_2c8;
  local_234 = 0;
  local_260 = *local_2c8;
  local_240 = local_2c8;
  local_244 = 1;
  iStack_25c = local_2c8[1];
  local_380 = *(undefined8 *)local_2c8;
  local_250 = local_2c8;
  local_254 = 2;
  local_378 = local_2c8[2];
  local_290 = local_2b8;
  local_200 = local_2b8;
  local_204 = 0;
  local_284 = *local_2b8;
  local_210 = local_2b8;
  local_214 = 1;
  iStack_280 = local_2b8[1];
  local_3a0 = *(undefined8 *)local_2b8;
  local_220 = local_2b8;
  local_224 = 2;
  local_398 = local_2b8[2];
  local_3ac = local_284 - local_260;
  iStack_3a8 = iStack_280 - iStack_25c;
  local_3a4 = local_398 - local_378;
  local_3b0 = 0;
  local_1f8 = &local_3b0;
  local_38c = local_3a0;
  local_384 = local_398;
  local_370 = local_380;
  local_368 = local_378;
  local_320 = &local_360;
  local_2a0 = local_3a0;
  local_298 = local_398;
  local_27c = local_398;
  local_278 = local_380;
  local_270 = local_378;
  local_258 = local_378;
  memcpy(local_448,local_2d8,0x3c);
  memcpy(auStack_400,local_320,0x3c);
  local_3c0 = CONCAT44(iStack_3a8,local_3ac);
  local_3b8 = local_3a4;
  local_3b4 = local_2bc;
  LoopConcurrentOnCpu<amrex::BaseFab<long>::copy<(amrex::RunOn)0>(amrex::BaseFab<long>const&,amrex::Box_const&,int,amrex::Box_const&,int,int)::_lambda(int,int,int,int)_1_>
            (in_stack_fffffffffffffbe8,in_stack_fffffffffffffbe4,in_stack_fffffffffffffbd8);
  return in_RDI;
}

Assistant:

BaseFab<T>&
BaseFab<T>::copy (const BaseFab<T>& src, const Box& srcbox, int srccomp,
                  const Box& destbox, int destcomp, int numcomp) noexcept
{
    AMREX_ASSERT(destbox.ok());
    AMREX_ASSERT(srcbox.sameSize(destbox));
    AMREX_ASSERT(src.box().contains(srcbox));
    AMREX_ASSERT(this->domain.contains(destbox));
    AMREX_ASSERT(srccomp >= 0 && srccomp+numcomp <= src.nComp());
    AMREX_ASSERT(destcomp >= 0 && destcomp+numcomp <= this->nvar);

    Array4<T> const& d = this->array();
    Array4<T const> const& s = src.const_array();
    const auto dlo = amrex::lbound(destbox);
    const auto slo = amrex::lbound(srcbox);
    const Dim3 offset{slo.x-dlo.x,slo.y-dlo.y,slo.z-dlo.z};

    AMREX_HOST_DEVICE_PARALLEL_FOR_4D_FLAG(run_on, destbox, numcomp, i, j, k, n,
    {
        d(i,j,k,n+destcomp) = s(i+offset.x,j+offset.y,k+offset.z,n+srccomp);
    });

    return *this;
}